

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

int mfprintf(mFILE *mf,char *fmt,...)

{
  char in_AL;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __size;
  bool bVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  args[0].reg_save_area = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vflen(fmt,args);
  __size = mf->alloced;
  while( true ) {
    if (mf->offset + (long)iVar1 <= __size) {
      args[0].overflow_arg_area = &stack0x00000008;
      args[0].gp_offset = 0x10;
      args[0].fp_offset = 0x30;
      args[0].reg_save_area = local_e8;
      uVar2 = vsprintf(mf->data + mf->offset,fmt,args);
      uVar5 = 0xffffffff;
      if (0 < (int)uVar2) {
        uVar4 = (ulong)uVar2 + mf->offset;
        mf->offset = uVar4;
        if (mf->size < uVar4) {
          mf->size = uVar4;
        }
      }
      if ((mf->fp != _stderr) || (iVar1 = mfflush(mf), iVar1 == 0)) {
        uVar5 = uVar2;
      }
      return uVar5;
    }
    bVar6 = __size == 0;
    __size = __size * 2;
    if (bVar6) {
      __size = 0x400;
    }
    pcVar3 = (char *)realloc(mf->data,__size);
    if (pcVar3 == (char *)0x0) break;
    mf->alloced = __size;
    mf->data = pcVar3;
  }
  return -1;
}

Assistant:

int mfprintf(mFILE *mf, char *fmt, ...) {
    int ret;
    size_t est_length;
    va_list args;

    va_start(args, fmt);
    est_length = vflen(fmt, args);
    va_end(args);
    while (est_length + mf->offset > mf->alloced) {
	size_t new_alloced = mf->alloced ? mf->alloced * 2 : 1024;
	void * new_data    = realloc(mf->data, new_alloced);
	if (NULL == new_data) return -1;
	mf->alloced = new_alloced;
	mf->data    = new_data;
    }

    va_start(args, fmt);
    ret = vsprintf(&mf->data[mf->offset], fmt, args);
    va_end(args);

    if (ret > 0) {
	mf->offset += ret;
	if (mf->size < mf->offset)
	    mf->size = mf->offset;
    }

    if (mf->fp == stderr) {
	/* Auto-flush for stderr */
	if (0 != mfflush(mf)) return -1;
    }

    return ret;
}